

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

QSize __thiscall QAbstractScrollArea::viewportSizeHint(QAbstractScrollArea *this)

{
  bool bVar1;
  QAbstractScrollAreaPrivate *pQVar2;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int h;
  QAbstractScrollAreaPrivate *d;
  QSize sh;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  QSize *in_stack_ffffffffffffffb0;
  QFontMetrics local_20 [8];
  int local_18 [2];
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractScrollArea *)0x499b9a);
  if (pQVar2->viewport != (QWidget *)0x0) {
    local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QSize)(**(code **)(*(long *)pQVar2->viewport + 0x70))();
    bVar1 = QSize::isValid(in_RDI);
    if (bVar1) goto LAB_00499c47;
  }
  local_18[1] = 10;
  QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_18[0] = QFontMetrics::height();
  qMax<int>(local_18 + 1,local_18);
  QFontMetrics::~QFontMetrics(local_20);
  QSize::QSize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
LAB_00499c47:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QAbstractScrollArea::viewportSizeHint() const
{
    Q_D(const QAbstractScrollArea);
    if (d->viewport) {
        const QSize sh = d->viewport->sizeHint();
        if (sh.isValid()) {
            return sh;
        }
    }
    const int h = qMax(10, fontMetrics().height());
    return QSize(6 * h, 4 * h);
}